

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O0

void __thiscall SongListModel::moveDown(SongListModel *this,int index)

{
  uint uVar1;
  Module *this_00;
  SongList *this_01;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  __a;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  __b;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  local_80;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  local_78;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  iter;
  undefined1 local_60 [8];
  PermanentEditor editor;
  QModelIndex local_30;
  uint local_14;
  SongListModel *pSStack_10;
  int index_local;
  SongListModel *this_local;
  
  local_14 = index;
  pSStack_10 = this;
  QModelIndex::QModelIndex(&local_30);
  uVar1 = local_14;
  QModelIndex::QModelIndex((QModelIndex *)&editor.mModule);
  QAbstractItemModel::beginMoveRows
            ((QModelIndex *)this,(int)&local_30,uVar1,(QModelIndex *)(ulong)uVar1,
             (int)&editor.mModule);
  Module::permanentEdit((PermanentEditor *)local_60,this->mModule);
  this_00 = Module::data(this->mModule);
  this_01 = trackerboy::Module::songs(this_00);
  trackerboy::SongList::moveDown(this_01,local_14);
  Module::PermanentEditor::~PermanentEditor((PermanentEditor *)local_60);
  local_80._M_current =
       (SongMeta *)
       std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::begin
                 (&this->mSongData);
  __a = __gnu_cxx::
        __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
        ::operator+(&local_80,(long)(int)local_14);
  local_78 = __a;
  __b = __gnu_cxx::
        __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
        ::operator+(&local_78,1);
  std::
  iter_swap<__gnu_cxx::__normal_iterator<SongListModel::SongMeta*,std::vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>>>,__gnu_cxx::__normal_iterator<SongListModel::SongMeta*,std::vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>>>>
            (__a,__b);
  QAbstractItemModel::endMoveRows();
  return;
}

Assistant:

void SongListModel::moveDown(int index) {
    // the + 2 is correct, qt is weird
    beginMoveRows(QModelIndex(), index, index, QModelIndex(), index + 2);
    {
        auto editor = mModule.permanentEdit();
        mModule.data().songs().moveDown(index);
    }

    auto iter = mSongData.begin() + index;
    std::iter_swap(iter, iter + 1);

    endMoveRows();
}